

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibverbs_communicator.cpp
# Opt level: O3

void __thiscall IBVerbsCommunicator::~IBVerbsCommunicator(IBVerbsCommunicator *this)

{
  pointer ptVar1;
  pointer puVar2;
  pointer pPVar3;
  pointer ppVar4;
  ulong uVar5;
  long lVar6;
  
  pPVar3 = (this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (*(long *)((long)&pPVar3->queue_pair + lVar6) != 0) {
        ibv_destroy_qp();
        pPVar3 = (this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if (*(long *)((long)&pPVar3->recv_complete_queue + lVar6) != 0) {
        ibv_destroy_cq();
        pPVar3 = (this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if (*(long *)((long)&pPVar3->send_complete_queue + lVar6) != 0) {
        ibv_destroy_cq();
        pPVar3 = (this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (ulong)(((long)(this->pq_world_).
                                    super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
                            -0x5555555555555555));
  }
  ppVar4 = (this->mr_world_).
           super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mr_world_).
      super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (*(long *)((long)&ppVar4->first + lVar6) != 0) {
        ibv_dereg_mr();
        ppVar4 = (this->mr_world_).
                 super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&ppVar4->first + lVar6) = 0;
      }
      if (*(long *)((long)&ppVar4->second + lVar6) != 0) {
        ibv_dereg_mr();
        ppVar4 = (this->mr_world_).
                 super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&ppVar4->second + lVar6) = 0;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->mr_world_).
                                   super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4));
  }
  if (this->pd_ != (ibv_pd *)0x0) {
    ibv_dealloc_pd();
  }
  if (this->context_ != (ibv_context *)0x0) {
    ibv_close_device();
  }
  if (this->dev_list_ != (ibv_device **)0x0) {
    ibv_free_device_list();
  }
  ptVar1 = (this->trace_other_).super__Vector_base<timespec,_std::allocator<timespec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_issue_recv_).super__Vector_base<timespec,_std::allocator<timespec>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_issue_redu_kernel_).super__Vector_base<timespec,_std::allocator<timespec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_issue_copy_kernel_).super__Vector_base<timespec,_std::allocator<timespec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_issue_send_).super__Vector_base<timespec,_std::allocator<timespec>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_reduced_).super__Vector_base<timespec,_std::allocator<timespec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ptVar1 = (this->trace_received_).super__Vector_base<timespec,_std::allocator<timespec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1);
  }
  ppVar4 = (this->mr_world_).
           super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar4 != (pointer)0x0) {
    operator_delete(ppVar4);
  }
  puVar2 = (this->psn_world_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pPVar3 = (this->pq_world_).super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pPVar3 != (pointer)0x0) {
    operator_delete(pPVar3);
    return;
  }
  return;
}

Assistant:

IBVerbsCommunicator::~IBVerbsCommunicator() {
  // release queues
  for (size_t i = 0; i < pq_world_.size(); i++) {
    if (pq_world_[i].queue_pair != NULL)
      ibv_destroy_qp(pq_world_[i].queue_pair);

    if (pq_world_[i].recv_complete_queue != NULL)
      ibv_destroy_cq(pq_world_[i].recv_complete_queue);

    if (pq_world_[i].send_complete_queue != NULL)
      ibv_destroy_cq(pq_world_[i].send_complete_queue);
  }

  // release memory region which is nonblocking-io but not freed.
  for (size_t i = 0; i < mr_world_.size(); i++) {
    // send
    if (mr_world_[i].first != NULL) {
      ibv_dereg_mr(mr_world_[i].first);
      mr_world_[i].first = NULL;
    }

    // recv
    if (mr_world_[i].second != NULL) {
      ibv_dereg_mr(mr_world_[i].second);
      mr_world_[i].second = NULL;
    }
  }

#ifdef USE_CUDA
  pool_.reset();
#endif

  if (pd_ != NULL) {
    ibv_dealloc_pd(pd_);
  }

  if (context_ != NULL) {
    ibv_close_device(context_);
  }

  if (dev_list_ != NULL) {
    ibv_free_device_list(dev_list_);
  }

#ifdef USE_TRACE
  DumpTrace();
#endif

#ifdef USE_CUDA
  if (tmp_gpu_buffer_ != NULL) {
    CUDACHECK(cudaFree(tmp_gpu_buffer_));
    tmp_gpu_buffer_ = NULL;
  }
#endif
}